

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O0

void __thiscall
fizplex::SimplexTest_LowerRowBoundedVarOptimalSolutionWithBoundFlip_Test::TestBody
          (SimplexTest_LowerRowBoundedVarOptimalSolutionWithBoundFlip_Test *this)

{
  initializer_list<double> l;
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  double in_stack_000002f0;
  double in_stack_000002f8;
  char *in_stack_00000300;
  char *in_stack_00000308;
  double in_stack_ffffffffffffff28;
  Result *in_stack_ffffffffffffff30;
  AssertionResult *pAVar3;
  undefined4 in_stack_ffffffffffffff38;
  ColType in_stack_ffffffffffffff3c;
  LP *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  AssertHelper in_stack_ffffffffffffff70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  RowType in_stack_ffffffffffffff8c;
  AssertHelper in_stack_ffffffffffffff90;
  Message local_68;
  undefined4 local_5c;
  AssertionResult local_58 [2];
  undefined8 local_38;
  undefined8 *local_30;
  undefined8 local_28;
  SimplexTest *in_stack_ffffffffffffffe0;
  
  LP::add_column(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                 (double)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,9.34401652697258e-318);
  local_38 = 0x4000000000000000;
  local_30 = &local_38;
  local_28 = 1;
  l._M_len._0_7_ = in_stack_ffffffffffffff50;
  l._M_array = (iterator)in_stack_ffffffffffffff48;
  l._M_len._7_1_ = in_stack_ffffffffffffff57;
  DVector::DVector((DVector *)in_stack_ffffffffffffff40,l);
  LP::add_row((LP *)in_stack_ffffffffffffff90.data_,in_stack_ffffffffffffff8c,
              in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78.ptr_,
              (DVector *)in_stack_ffffffffffffff70.data_);
  DVector::~DVector((DVector *)0x1cdc35);
  SimplexTest::solve_lp(in_stack_ffffffffffffffe0);
  local_5c = 1;
  pAVar3 = local_58;
  testing::internal::EqHelper<false>::Compare<fizplex::Simplex::Result,fizplex::Simplex::Result>
            (&pAVar3->success_,(char *)in_stack_ffffffffffffff40,
             (Result *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             in_stack_ffffffffffffff30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1cdcef);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex_test.cc"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff90,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff90);
    testing::Message::~Message((Message *)0x1cdd3d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cdd8c);
  pAVar3 = (AssertionResult *)&stack0xffffffffffffff80;
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_00000308,in_stack_00000300,in_stack_000002f8,in_stack_000002f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1cde1e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex_test.cc"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff70,(Message *)&stack0xffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
    testing::Message::~Message((Message *)0x1cde6a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cdeb6);
  return;
}

Assistant:

TEST_F(SimplexTest, LowerRowBoundedVarOptimalSolutionWithBoundFlip) {
  lp.add_column(ColType::Bounded, 0, 5, -1);
  lp.add_row(RowType::LE, -inf, 14, {2});

  solve_lp();
  EXPECT_EQ(Simplex::Result::OptimalSolution, result);
  EXPECT_DOUBLE_EQ(-5.0, z);
}